

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_3x3_pack16.h
# Opt level: O3

void ncnn::conv3x3s1_winograd43_pack16_avx512
               (Mat *bottom_blob,Mat *top_blob,Mat *kernel_tm,Mat *bias,Option *opt)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  int iVar5;
  size_t _elemsize;
  int *piVar6;
  void *pvVar7;
  undefined1 auVar8 [16];
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  int iVar17;
  uint uVar18;
  undefined1 (*pauVar19) [64];
  int iVar20;
  int iVar21;
  int iVar22;
  Mat *dst;
  uint uVar23;
  int iVar24;
  ulong uVar25;
  ulong uVar26;
  undefined1 (*pauVar27) [64];
  ulong uVar28;
  long lVar29;
  ulong uVar30;
  long lVar31;
  long lVar32;
  Option *opt_00;
  undefined1 auVar33 [16];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  ulong local_b90;
  long local_b88;
  undefined1 local_b80 [16];
  Mat local_b20;
  Option *local_ad0;
  Mat *local_ac8;
  Mat local_ac0;
  undefined8 local_a78;
  ulong local_a70;
  Mat *local_a68;
  size_t local_a60;
  Mat *local_a58;
  long local_a50;
  long local_a48;
  long local_a40;
  long local_a38;
  undefined1 local_a30 [64];
  size_t local_9f0;
  undefined1 local_9e0 [64];
  size_t local_9a0;
  undefined1 local_990 [16];
  undefined1 auStack_980 [384];
  undefined1 auStack_800 [384];
  undefined1 auStack_680 [384];
  undefined1 auStack_500 [384];
  undefined1 auStack_380 [384];
  undefined1 auStack_200 [384];
  undefined1 auStack_80 [80];
  
  iVar21 = bottom_blob->c;
  _elemsize = bottom_blob->elemsize;
  iVar5 = bottom_blob->elempack;
  uVar1 = top_blob->w;
  uVar3 = top_blob->h;
  auVar33._4_4_ = uVar3;
  auVar33._0_4_ = uVar1;
  iVar24 = top_blob->c;
  piVar6 = bottom_blob->refcount;
  local_ac0.data = bottom_blob->data;
  local_ac0.refcount._0_4_ = SUB84(bottom_blob->refcount,0);
  local_ac0.refcount._4_4_ = (undefined4)((ulong)bottom_blob->refcount >> 0x20);
  local_ac0.allocator = bottom_blob->allocator;
  iVar17 = bottom_blob->h;
  iVar20 = bottom_blob->w;
  uVar9 = bottom_blob->dims;
  uVar10 = bottom_blob->w;
  uVar11 = bottom_blob->h;
  uVar12 = bottom_blob->d;
  local_ac0.cstep = bottom_blob->cstep;
  if (piVar6 != (int *)0x0) {
    LOCK();
    *piVar6 = *piVar6 + 1;
    UNLOCK();
    iVar20 = bottom_blob->w;
    iVar17 = bottom_blob->h;
  }
  auVar46._8_4_ = 3;
  auVar46._0_8_ = 0x300000003;
  auVar46._12_4_ = 3;
  auVar33._8_8_ = 0;
  auVar33 = vpaddd_avx512vl(auVar33,auVar46);
  auVar46 = vpsrad_avx(auVar33,0x1f);
  auVar46 = vpsrld_avx(auVar46,0x1e);
  local_b80 = vpaddd_avx(auVar33,auVar46);
  auVar8._8_4_ = 0xfffffffc;
  auVar8._0_8_ = 0xfffffffcfffffffc;
  auVar8._12_4_ = 0xfffffffc;
  local_990 = vpandd_avx512vl(local_b80,auVar8);
  local_a70 = (ulong)local_990._4_4_;
  local_a78 = CONCAT44((int)(local_ac0.cstep >> 0x20),local_990._0_4_);
  local_ac0.elemsize = _elemsize;
  local_ac0.elempack = iVar5;
  local_ac0.dims = uVar9;
  local_ac0.w = uVar10;
  local_ac0.h = uVar11;
  local_ac0.d = uVar12;
  local_ac0.c = iVar21;
  local_a68 = bias;
  local_a58 = kernel_tm;
  copy_make_border(bottom_blob,&local_ac0,0,(local_990._4_4_ + 2) - iVar17,0,
                   (local_990._0_4_ + 2) - iVar20,0,0.0,opt);
  auVar46 = vpsrad_avx512vl(local_b80,2);
  local_9f0 = 0;
  auVar33 = vpshufd_avx(auVar46,0x55);
  auVar33 = vpmulld_avx(auVar33,auVar46);
  local_a30._0_8_ = (void *)0x0;
  local_a30._8_4_ = 0;
  local_a30._12_4_ = 0;
  local_a30._16_8_ = 0;
  local_a30._24_4_ = 0;
  local_a30._32_8_ = (Allocator *)0x0;
  local_a30._40_4_ = 0;
  local_a30._44_4_ = 0;
  local_a30._48_12_ = SUB1612((undefined1  [16])0x0,4);
  local_ad0 = opt;
  local_ac8 = top_blob;
  local_a60 = _elemsize;
  Mat::create((Mat *)local_a30,auVar33._0_4_,0x24,iVar21,_elemsize,iVar5,opt->workspace_allocator);
  dst = local_ac8;
  opt_00 = local_ad0;
  if (0 < (long)local_ac0.c) {
    iVar21 = local_ac0.h + 1;
    if (-1 < local_ac0.h + -2) {
      iVar21 = local_ac0.h + -2;
    }
    uVar23 = iVar21 >> 2;
    iVar21 = local_ac0.w + 1;
    if (-1 < local_ac0.w + -2) {
      iVar21 = local_ac0.w + -2;
    }
    uVar18 = iVar21 >> 2;
    iVar21 = uVar18 * uVar23;
    uVar30 = 1;
    if (1 < (int)uVar18) {
      uVar30 = (ulong)uVar18;
    }
    if ((int)uVar23 < 2) {
      uVar23 = 1;
    }
    local_a38 = (long)(iVar21 * 0x20) * 4;
    local_a40 = (long)(iVar21 * 0x30) * 4;
    local_a48 = (long)(iVar21 * 0x40) * 4;
    local_a50 = (long)(iVar21 * 0x50) * 4;
    local_b88 = 0;
    auVar34 = vbroadcastss_avx512f(ZEXT416(0xc0800000));
    auVar35 = vbroadcastss_avx512f(ZEXT416(0xc0a00000));
    auVar36 = vbroadcastss_avx512f(ZEXT416(0xc0000000));
    do {
      if (5 < local_ac0.h) {
        lVar29 = local_a30._16_8_ * local_9f0 * local_b88;
        local_b80._0_8_ =
             (long)local_ac0.data + local_ac0.elemsize * local_ac0.cstep * local_b88 + 0x140;
        local_b90 = 0;
        uVar26 = 0;
        do {
          if (5 < local_ac0.w) {
            uVar28 = 0;
            uVar25 = local_b90;
            pauVar27 = (undefined1 (*) [64])local_b80._0_8_;
            do {
              lVar31 = -0x180;
              pauVar19 = pauVar27;
              do {
                auVar43 = pauVar19[-4];
                auVar41 = pauVar19[-3];
                auVar44 = pauVar19[-2];
                auVar42 = pauVar19[-1];
                auVar37 = vfnmadd132ps_avx512vl(pauVar19[-5],auVar42,auVar34);
                auVar37 = vfmadd231ps_avx512f(auVar37,auVar41,auVar35);
                auVar38 = vaddps_avx512f(auVar41,auVar43);
                auVar39 = vaddps_avx512f(auVar42,auVar44);
                auVar38 = vfmadd231ps_avx512f(auVar39,auVar34,auVar38);
                auVar39 = vsubps_avx512f(auVar43,auVar41);
                auVar40 = vsubps_avx512f(auVar42,auVar44);
                auVar39 = vfnmadd231ps_avx512f(auVar40,auVar34,auVar39);
                auVar40 = vsubps_avx512f(auVar43,auVar44);
                auVar41 = vsubps_avx512f(auVar42,auVar41);
                auVar42 = vfmadd213ps_avx512f(auVar36,auVar40,auVar41);
                auVar41 = vfnmadd213ps_avx512f(auVar40,auVar36,auVar41);
                auVar43 = vfnmadd213ps_avx512f(auVar43,auVar34,*pauVar19);
                auVar43 = vfmadd231ps_avx512f(auVar43,auVar35,auVar44);
                *(undefined1 (*) [64])(auStack_800 + lVar31) = auVar37;
                *(undefined1 (*) [64])(auStack_680 + lVar31) = auVar38;
                *(undefined1 (*) [64])(auStack_500 + lVar31) = auVar39;
                *(undefined1 (*) [64])(auStack_380 + lVar31) = auVar42;
                *(undefined1 (*) [64])(auStack_200 + lVar31) = auVar41;
                *(undefined1 (*) [64])(auStack_80 + lVar31) = auVar43;
                pauVar19 = (undefined1 (*) [64])(*pauVar19 + (long)(local_ac0.w << 4) * 4);
                lVar31 = lVar31 + 0x40;
              } while (lVar31 != 0);
              lVar32 = 0x140;
              lVar31 = uVar25;
              do {
                auVar43 = *(undefined1 (*) [64])((long)&local_ac0.cstep + lVar32);
                auVar41 = *(undefined1 (*) [64])((long)&local_a40 + lVar32);
                auVar44 = *(undefined1 (*) [64])(local_a30 + lVar32 + 0x30);
                auVar42 = *(undefined1 (*) [64])(local_9e0 + lVar32 + 0x20);
                auVar37 = vfnmadd132ps_avx512vl
                                    (*(undefined1 (*) [64])((long)&local_ac0.data + lVar32),auVar42,
                                     auVar34);
                auVar37 = vfmadd231ps_avx512f(auVar37,auVar41,auVar35);
                auVar38 = vaddps_avx512f(auVar41,auVar43);
                auVar39 = vaddps_avx512f(auVar42,auVar44);
                auVar38 = vfmadd231ps_avx512f(auVar39,auVar34,auVar38);
                auVar39 = vsubps_avx512f(auVar43,auVar41);
                auVar40 = vsubps_avx512f(auVar42,auVar44);
                auVar39 = vfnmadd231ps_avx512f(auVar40,auVar34,auVar39);
                auVar40 = vsubps_avx512f(auVar43,auVar44);
                auVar41 = vsubps_avx512f(auVar42,auVar41);
                auVar42 = vfmadd213ps_avx512f(auVar36,auVar40,auVar41);
                auVar41 = vfnmadd213ps_avx512f(auVar40,auVar36,auVar41);
                auVar43 = vfnmadd213ps_avx512f
                                    (auVar43,auVar34,*(undefined1 (*) [64])(auStack_980 + lVar32));
                auVar43 = vfmadd231ps_avx512f(auVar43,auVar35,auVar44);
                *(undefined1 (*) [64])(local_a30._0_8_ + lVar31 + lVar29) = auVar37;
                *(undefined1 (*) [64])
                 (local_a30._0_8_ + lVar31 + (long)(iVar21 * 0x10) * 4 + lVar29) = auVar38;
                *(undefined1 (*) [64])(local_a30._0_8_ + lVar31 + local_a38 + lVar29) = auVar39;
                *(undefined1 (*) [64])(local_a30._0_8_ + lVar31 + local_a40 + lVar29) = auVar42;
                *(undefined1 (*) [64])(local_a30._0_8_ + lVar31 + local_a48 + lVar29) = auVar41;
                *(undefined1 (*) [64])(local_a30._0_8_ + lVar31 + local_a50 + lVar29) = auVar43;
                lVar32 = lVar32 + 0x180;
                lVar31 = lVar31 + (long)(iVar21 * 0x60) * 4;
              } while (lVar32 != 0xa40);
              uVar28 = uVar28 + 1;
              pauVar27 = pauVar27 + 4;
              uVar25 = uVar25 + 0x40;
            } while (uVar28 != uVar30);
          }
          uVar26 = uVar26 + 1;
          local_b80._0_8_ =
               (undefined1 *)local_b80._0_8_ + (long)local_ac0.w * local_ac0.elemsize * 4;
          local_b90 = local_b90 + (long)(int)uVar18 * 0x40;
        } while (uVar26 != uVar23);
      }
      local_b88 = local_b88 + 1;
    } while (local_b88 != local_ac0.c);
  }
  piVar6 = (int *)CONCAT44(local_ac0.refcount._4_4_,local_ac0.refcount._0_4_);
  if (piVar6 != (int *)0x0) {
    LOCK();
    *piVar6 = *piVar6 + -1;
    UNLOCK();
    if (*piVar6 == 0) {
      if (local_ac0.allocator == (Allocator *)0x0) {
        if (local_ac0.data != (void *)0x0) {
          free(local_ac0.data);
        }
      }
      else {
        (*(local_ac0.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  local_ac0.cstep = 0;
  local_ac0.data = (void *)0x0;
  local_ac0.refcount._0_4_ = 0;
  local_ac0.refcount._4_4_ = 0;
  local_ac0.elemsize = 0;
  local_ac0.elempack = 0;
  local_ac0.h = 0;
  local_ac0.d = 0;
  local_ac0.c = 0;
  local_ac0.allocator = (Allocator *)0x0;
  local_ac0.dims = 0;
  local_ac0.w = 0;
  local_9a0 = 0;
  local_9e0._0_8_ = (void *)0x0;
  local_9e0._8_4_ = 0;
  local_9e0._12_4_ = 0;
  local_9e0._16_8_ = 0;
  local_9e0._24_4_ = 0;
  local_9e0._32_8_ = (Allocator *)0x0;
  local_9e0._40_4_ = 0;
  local_9e0._44_4_ = 0;
  local_9e0._48_12_ = SUB1612((undefined1  [16])0x0,4);
  convolution_winograd_dot_pack16_avx512((Mat *)local_a30,iVar24,local_a58,(Mat *)local_9e0,opt_00);
  local_b20.cstep = 0;
  local_b20.data = (void *)0x0;
  local_b20.refcount._0_4_ = 0;
  local_b20.refcount._4_4_ = 0;
  local_b20.elemsize = 0;
  local_b20.elempack = 0;
  local_b20.allocator = (Allocator *)0x0;
  local_b20.dims = 0;
  local_b20.w = 0;
  local_b20.h = 0;
  local_b20.d = 0;
  local_b20.c = 0;
  uVar2 = dst->w;
  uVar4 = dst->h;
  auVar45._4_4_ = uVar4;
  auVar45._0_4_ = uVar2;
  auVar45._8_8_ = 0;
  uVar30 = vpcmpd_avx512vl(auVar45,local_990,4);
  if ((uVar30 & 3) == 0) {
    if (&local_b20 == dst) {
      iVar24 = 0;
      iVar17 = 0;
      goto LAB_001e785e;
    }
    piVar6 = dst->refcount;
    if (piVar6 != (int *)0x0) {
      LOCK();
      *piVar6 = *piVar6 + 1;
      UNLOCK();
    }
    local_b20.data = dst->data;
    local_b20.refcount._0_4_ = SUB84(dst->refcount,0);
    local_b20.refcount._4_4_ = (undefined4)((ulong)dst->refcount >> 0x20);
    local_b20.elemsize = dst->elemsize;
    local_b20.elempack = dst->elempack;
    local_b20.allocator = dst->allocator;
    uVar13 = dst->dims;
    uVar14 = dst->w;
    uVar15 = dst->h;
    uVar16 = dst->d;
    local_b20.c = dst->c;
    local_b20.cstep = dst->cstep;
    iVar5 = dst->w;
    iVar21 = dst->h;
    local_b20.dims = uVar13;
    local_b20.w = uVar14;
    local_b20.h = uVar15;
    local_b20.d = uVar16;
  }
  else {
    Mat::create(&local_b20,(int)local_a78,(int)local_a70,iVar24,local_a60,iVar5,
                opt_00->workspace_allocator);
    iVar5 = local_b20.w;
    iVar21 = local_b20.h;
  }
  iVar24 = iVar21;
  iVar17 = iVar5;
  if (0 < local_b20.c) {
    pvVar7 = local_a68->data;
    iVar20 = iVar21 + 3;
    if (-1 < iVar21) {
      iVar20 = iVar21;
    }
    iVar24 = iVar5 + 3;
    if (-1 < iVar5) {
      iVar24 = iVar5;
    }
    uVar23 = iVar24 >> 2;
    iVar22 = uVar23 * (iVar20 >> 2);
    uVar30 = 0;
    auVar34 = vbroadcastss_avx512f(ZEXT416(0x40000000));
    auVar35 = vbroadcastss_avx512f(ZEXT416(0x40800000));
    auVar36 = vbroadcastss_avx512f(ZEXT416(0x41000000));
    do {
      if (pvVar7 == (void *)0x0) {
        auVar43 = ZEXT1664(ZEXT816(0) << 0x40);
      }
      else {
        auVar43 = *(undefined1 (*) [64])((long)pvVar7 + uVar30 * 0x40);
      }
      if (3 < iVar21) {
        local_b80._0_8_ =
             (long)local_b20.data + local_b20.elemsize * local_b20.cstep * uVar30 + 0xc0;
        local_b90 = 0;
        uVar26 = 0;
        do {
          if (3 < iVar5) {
            uVar28 = 0;
            uVar25 = local_b90;
            pauVar27 = (undefined1 (*) [64])local_b80._0_8_;
            do {
              pauVar19 = (undefined1 (*) [64])
                         (local_9e0._0_8_ +
                         (uVar25 >> 4 & 0xfffffff) * 0x40 + local_9e0._16_8_ * local_9a0 * uVar30);
              lVar29 = -0x180;
              do {
                auVar41 = vaddps_avx512f(*(undefined1 (*) [64])
                                          (*pauVar19 + (long)(iVar22 * 0x20) * 4),
                                         *(undefined1 (*) [64])
                                          (*pauVar19 + (long)(iVar22 * 0x10) * 4));
                auVar44 = vsubps_avx512f(*(undefined1 (*) [64])
                                          (*pauVar19 + (long)(iVar22 * 0x10) * 4),
                                         *(undefined1 (*) [64])
                                          (*pauVar19 + (long)(iVar22 * 0x20) * 4));
                auVar42 = vaddps_avx512f(*(undefined1 (*) [64])
                                          (*pauVar19 + (long)(iVar22 * 0x40) * 4),
                                         *(undefined1 (*) [64])
                                          (*pauVar19 + (long)(iVar22 * 0x30) * 4));
                auVar37 = vsubps_avx512f(*(undefined1 (*) [64])
                                          (*pauVar19 + (long)(iVar22 * 0x30) * 4),
                                         *(undefined1 (*) [64])
                                          (*pauVar19 + (long)(iVar22 * 0x40) * 4));
                auVar38 = vaddps_avx512f(auVar41,*pauVar19);
                auVar38 = vaddps_avx512f(auVar38,auVar42);
                auVar39 = vaddps_avx512f(auVar44,*(undefined1 (*) [64])
                                                  (*pauVar19 + (long)(iVar22 * 0x50) * 4));
                auVar44 = vfmadd231ps_avx512f(auVar44,auVar37,auVar34);
                auVar41 = vfmadd231ps_avx512f(auVar41,auVar42,auVar35);
                auVar42 = vfmadd231ps_avx512f(auVar39,auVar37,auVar36);
                *(undefined1 (*) [64])(auStack_800 + lVar29) = auVar38;
                *(undefined1 (*) [64])(auStack_680 + lVar29) = auVar44;
                *(undefined1 (*) [64])(auStack_500 + lVar29) = auVar41;
                *(undefined1 (*) [64])(auStack_380 + lVar29) = auVar42;
                pauVar19 = (undefined1 (*) [64])(*pauVar19 + (long)(iVar22 * 0x60) * 4);
                lVar29 = lVar29 + 0x40;
              } while (lVar29 != 0);
              lVar29 = 0x140;
              pauVar19 = pauVar27;
              do {
                auVar41 = *(undefined1 (*) [64])((long)&local_ac0.cstep + lVar29);
                auVar44 = vaddps_avx512f(*(undefined1 (*) [64])((long)&local_a40 + lVar29),auVar41);
                auVar41 = vsubps_avx512f(auVar41,*(undefined1 (*) [64])((long)&local_a40 + lVar29));
                auVar42 = vaddps_avx512f(*(undefined1 (*) [64])(local_9e0 + lVar29 + 0x20),
                                         *(undefined1 (*) [64])(local_a30 + lVar29 + 0x30));
                auVar37 = vsubps_avx512f(*(undefined1 (*) [64])(local_a30 + lVar29 + 0x30),
                                         *(undefined1 (*) [64])(local_9e0 + lVar29 + 0x20));
                auVar38 = vaddps_avx512f(auVar43,*(undefined1 (*) [64])
                                                  ((long)&local_ac0.data + lVar29));
                auVar38 = vaddps_avx512f(auVar38,auVar44);
                auVar38 = vaddps_avx512f(auVar38,auVar42);
                auVar39 = vaddps_avx512f(auVar41,*(undefined1 (*) [64])(auStack_980 + lVar29));
                auVar41 = vfmadd231ps_avx512f(auVar41,auVar37,auVar34);
                auVar41 = vaddps_avx512f(auVar41,auVar43);
                auVar44 = vfmadd231ps_avx512f(auVar44,auVar42,auVar35);
                auVar44 = vaddps_avx512f(auVar44,auVar43);
                auVar42 = vfmadd231ps_avx512f(auVar39,auVar37,auVar36);
                auVar42 = vaddps_avx512f(auVar42,auVar43);
                pauVar19[-3] = auVar38;
                pauVar19[-2] = auVar41;
                pauVar19[-1] = auVar44;
                *pauVar19 = auVar42;
                lVar29 = lVar29 + 0x180;
                pauVar19 = (undefined1 (*) [64])(*pauVar19 + (long)(iVar5 << 4) * 4);
              } while (lVar29 != 0x740);
              uVar28 = uVar28 + 1;
              uVar25 = uVar25 + 0x10;
              pauVar27 = pauVar27 + 4;
            } while (uVar28 != uVar23);
          }
          uVar26 = uVar26 + 1;
          local_b90 = local_b90 + (ulong)uVar23 * 0x10;
          local_b80._0_8_ =
               (undefined1 *)local_b80._0_8_ + (long)local_b20.w * local_b20.elemsize * 4;
        } while (uVar26 != (uint)(iVar20 >> 2));
      }
      uVar30 = uVar30 + 1;
      dst = local_ac8;
      opt_00 = local_ad0;
      iVar24 = local_b20.h;
      iVar17 = local_b20.w;
    } while (uVar30 != (uint)local_b20.c);
  }
LAB_001e785e:
  copy_cut_border(&local_b20,dst,0,iVar24 - dst->h,0,iVar17 - dst->w,opt_00);
  piVar6 = (int *)CONCAT44(local_b20.refcount._4_4_,local_b20.refcount._0_4_);
  if (piVar6 != (int *)0x0) {
    LOCK();
    *piVar6 = *piVar6 + -1;
    UNLOCK();
    if (*piVar6 == 0) {
      if (local_b20.allocator == (Allocator *)0x0) {
        if (local_b20.data != (void *)0x0) {
          free(local_b20.data);
        }
      }
      else {
        (*(local_b20.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  piVar6 = (int *)CONCAT44(local_9e0._12_4_,local_9e0._8_4_);
  if (piVar6 != (int *)0x0) {
    LOCK();
    *piVar6 = *piVar6 + -1;
    UNLOCK();
    if (*piVar6 == 0) {
      if ((Allocator *)local_9e0._32_8_ == (Allocator *)0x0) {
        if ((void *)local_9e0._0_8_ != (void *)0x0) {
          free((void *)local_9e0._0_8_);
        }
      }
      else {
        (*(*(_func_int ***)local_9e0._32_8_)[3])();
      }
    }
  }
  piVar6 = (int *)CONCAT44(local_a30._12_4_,local_a30._8_4_);
  if (piVar6 != (int *)0x0) {
    LOCK();
    *piVar6 = *piVar6 + -1;
    UNLOCK();
    if (*piVar6 == 0) {
      if ((Allocator *)local_a30._32_8_ == (Allocator *)0x0) {
        if ((void *)local_a30._0_8_ != (void *)0x0) {
          free((void *)local_a30._0_8_);
        }
      }
      else {
        (*(*(_func_int ***)local_a30._32_8_)[3])();
      }
    }
  }
  piVar6 = (int *)CONCAT44(local_ac0.refcount._4_4_,local_ac0.refcount._0_4_);
  if (piVar6 != (int *)0x0) {
    LOCK();
    *piVar6 = *piVar6 + -1;
    UNLOCK();
    if (*piVar6 == 0) {
      if (local_ac0.allocator == (Allocator *)0x0) {
        if (local_ac0.data != (void *)0x0) {
          free(local_ac0.data);
        }
      }
      else {
        (*(local_ac0.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return;
}

Assistant:

static void conv3x3s1_winograd43_pack16_avx512(const Mat& bottom_blob, Mat& top_blob, const Mat& kernel_tm, const Mat& bias, const Option& opt)
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int inch = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    int outw = top_blob.w;
    int outh = top_blob.h;
    int outch = top_blob.c;

    // pad to 4n+2
    Mat bottom_blob_bordered = bottom_blob;

    outw = (outw + 3) / 4 * 4;
    outh = (outh + 3) / 4 * 4;

    w = outw + 2;
    h = outh + 2;
    copy_make_border(bottom_blob, bottom_blob_bordered, 0, h - bottom_blob.h, 0, w - bottom_blob.w, BORDER_CONSTANT, 0.f, opt);

    // BEGIN transform input
    Mat bottom_blob_tm;
    {
        int w_tiles = outw / 4;
        int h_tiles = outh / 4;
        const int tiles = w_tiles * h_tiles;

        bottom_blob_tm.create(tiles, 36, inch, elemsize, elempack, opt.workspace_allocator);
        conv3x3s1_winograd43_transform_input_pack16_avx512(bottom_blob_bordered, bottom_blob_tm, opt);
    }
    bottom_blob_bordered = Mat();
    // END transform input

    // BEGIN dot
    Mat top_blob_tm;
    convolution_winograd_dot_pack16_avx512(bottom_blob_tm, outch, kernel_tm, top_blob_tm, opt);
    // END dot

    // BEGIN transform output
    Mat top_blob_bordered;
    if (outw == top_blob.w && outh == top_blob.h)
    {
        top_blob_bordered = top_blob;
    }
    else
    {
        top_blob_bordered.create(outw, outh, outch, elemsize, elempack, opt.workspace_allocator);
    }
    {
        conv3x3s1_winograd43_transform_output_pack16_avx512(top_blob_tm, top_blob_bordered, bias, opt);
    }
    // END transform output

    // cut result pad
    copy_cut_border(top_blob_bordered, top_blob, 0, top_blob_bordered.h - top_blob.h, 0, top_blob_bordered.w - top_blob.w, opt);
}